

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::StreamingListener
          (StreamingListener *this,string *host,string *port)

{
  SocketWriter *this_00;
  string *port_local;
  string *host_local;
  StreamingListener *this_local;
  
  EmptyTestEventListener::EmptyTestEventListener(&this->super_EmptyTestEventListener);
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__StreamingListener_001b5ac0;
  this_00 = (SocketWriter *)operator_new(0x50);
  SocketWriter::SocketWriter(this_00,host,port);
  scoped_ptr<testing::internal::StreamingListener::AbstractSocketWriter>::scoped_ptr
            (&this->socket_writer_,(AbstractSocketWriter *)this_00);
  Start(this);
  return;
}

Assistant:

StreamingListener(const std::string& host, const std::string& port)
      : socket_writer_(new SocketWriter(host, port)) {
    Start();
  }